

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_resource_file(CVmImageLoader *this,CVmImageLoaderMres *res_ifc)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  undefined8 *in_RDI;
  char buf [128];
  CVmImageLoaderMres *in_stack_00000090;
  uint flags;
  ulong siz;
  CVmImageLoader *in_stack_000000a0;
  int done;
  CVmImageLoaderMres *in_stack_00000180;
  ulong in_stack_00000188;
  CVmImageLoader *in_stack_00000190;
  char local_a8 [4];
  undefined1 auStack_a4 [4];
  undefined1 auStack_a0 [112];
  CVmImageLoader *in_stack_ffffffffffffffd0;
  
  read_image_header(in_stack_ffffffffffffffd0);
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (bVar1) {
            return;
          }
          (**(code **)(*(long *)*in_RDI + 0x18))((long *)*in_RDI,local_a8,10);
          uVar4 = ::osrp4(auStack_a4);
          uVar2 = ::osrp2(auStack_a0);
          iVar3 = block_type_is(local_a8,"EOF ");
          if (iVar3 == 0) break;
          bVar1 = true;
        }
        iVar3 = block_type_is(local_a8,"MRES");
        if (iVar3 == 0) break;
        load_mres(in_stack_000000a0,siz,in_stack_00000090);
      }
      iVar3 = block_type_is(local_a8,"MREL");
      if (iVar3 == 0) break;
      load_mres_link(in_stack_00000190,in_stack_00000188,in_stack_00000180);
    }
    if ((uVar2 & 1) != 0) break;
    (**(code **)(*(long *)*in_RDI + 0x48))((long *)*in_RDI,uVar4 & 0xffffffff);
  }
  err_throw_a(0x131,1,8);
}

Assistant:

void CVmImageLoader::load_resource_file(CVmImageLoaderMres *res_ifc)
{
    int done;

    /* read and validate the image header */
    read_image_header();

    /* load the blocks */
    for (done = FALSE ; !done ; )
    {
        ulong siz;
        uint flags;
        char buf[128];

        /* read the next data block header */
        fp_->copy_data(buf, 10);

        /* get the size */
        siz = t3rp4u(buf + 4);

        /* get the flags */
        flags = osrp2(buf + 8);

        /* check the block type */
        if (block_type_is(buf, "EOF "))
        {
            /* we're done */
            done = TRUE;
        }
        else if (block_type_is(buf, "MRES"))
        {
            /* load the multimedia resource block */
            load_mres(siz, res_ifc);
        }
        else if (block_type_is(buf, "MREL"))
        {
            /* load the multimedia resource link block */
            load_mres_link(siz, res_ifc);
        }
        else
        {
            /* 
             *   Unknown block type - ignore it, unless it's mandatory, in
             *   which case this is an error.  This is a version-related
             *   error (fixable by updating to the latest version), so set
             *   the version flag in the exception, if we throw one.  
             */
            if ((flags & VMIMAGE_DBF_MANDATORY) != 0)
                err_throw_a(VMERR_UNKNOWN_IMAGE_BLOCK, 1,
                            ERR_TYPE_VERSION_FLAG);

            /* skip past the block */
            fp_->skip_ahead(siz);
        }
    }
}